

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_18d2769::LevelTest_TestLevelMonitoringHighBitrate_Test::
~LevelTest_TestLevelMonitoringHighBitrate_Test(LevelTest_TestLevelMonitoringHighBitrate_Test *this)

{
  LevelTest::~LevelTest(&this->super_LevelTest);
  operator_delete(this);
  return;
}

Assistant:

TEST_P(LevelTest, TestLevelMonitoringHighBitrate) {
  // To save run time, we only test speed 4.
  if (cpu_used_ == 4) {
    libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352, 288,
                                       30, 1, 0, 30);
    target_level_ = kLevelKeepStats;
    cfg_.rc_target_bitrate = 4000;
    cfg_.g_limit = 30;
    ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
    ASSERT_LE(level_[0], 4);
  }
}